

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

POMDPXState * __thiscall
despot::MemoryPool<despot::POMDPXState>::Allocate(MemoryPool<despot::POMDPXState> *this)

{
  POMDPXState *pPVar1;
  pointer ppPVar2;
  
  ppPVar2 = (this->freelist_).
            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->freelist_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppPVar2) {
    NewChunk(this);
    ppPVar2 = (this->freelist_).
              super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  pPVar1 = ppPVar2[-1];
  (this->freelist_).
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppPVar2 + -1;
  if ((pPVar1->super_State).super_MemoryObject.allocated_ != true) {
    (pPVar1->super_State).super_MemoryObject.allocated_ = true;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pPVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::POMDPXState>::Allocate() [T = despot::POMDPXState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}